

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsMacros.cpp
# Opt level: O0

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
generateMipsMacroAbs
          (Parser *parser,MipsRegisterData *registers,MipsImmediateData *immediates,int flags)

{
  string *psVar1;
  undefined4 in_register_0000000c;
  uint in_R8D;
  initializer_list<AssemblyTemplateArgument> variables;
  AssemblyTemplateArgument *local_1b0;
  AssemblyTemplateArgument local_158;
  char *local_130;
  string local_128 [32];
  char *local_108;
  string local_100 [32];
  char *local_e0;
  string local_d8 [32];
  undefined1 local_b8 [16];
  undefined1 local_a8 [8];
  string macroText;
  string local_78 [8];
  string subop;
  string sraop;
  char *templateAbs;
  int flags_local;
  MipsImmediateData *immediates_local;
  MipsRegisterData *registers_local;
  Parser *parser_local;
  
  std::__cxx11::string::string((string *)(subop.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_78);
  if ((in_R8D & 0xf) == 5) {
    std::__cxx11::string::operator=((string *)(subop.field_2._M_local_buf + 8),"sra");
    std::__cxx11::string::operator=(local_78,"subu");
  }
  else {
    if ((in_R8D & 0xf) != 7) {
      std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
      unique_ptr<std::default_delete<CAssemblerCommand>,void>
                ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
                 (nullptr_t)0x0);
      macroText.field_2._8_4_ = 1;
      goto LAB_002133c4;
    }
    std::__cxx11::string::operator=((string *)(subop.field_2._M_local_buf + 8),"dsra32");
    std::__cxx11::string::operator=(local_78,"dsubu");
  }
  preprocessMacro_abi_cxx11_
            ((string *)local_a8,
             "\n\t\t%sraop% \tr1,%rs%,31\n\t\txor \t\t%rd%,%rs%,r1\n\t\t%subop% \t%rd%,%rd%,r1\n\t",
             (MipsImmediateData *)CONCAT44(in_register_0000000c,flags));
  local_158.variableName = "%rd%";
  psVar1 = Identifier::string_abi_cxx11_
                     ((Identifier *)&immediates[1].primary.expression.constExpression);
  std::__cxx11::string::string((string *)&local_158.value,(string *)psVar1);
  local_130 = "%rs%";
  psVar1 = Identifier::string_abi_cxx11_((Identifier *)&(immediates->primary).expression);
  std::__cxx11::string::string(local_128,(string *)psVar1);
  local_108 = "%sraop%";
  std::__cxx11::string::string(local_100,(string *)(subop.field_2._M_local_buf + 8));
  local_e0 = "%subop%";
  std::__cxx11::string::string(local_d8,local_78);
  variables._M_array = (iterator)(ulong)in_R8D;
  local_b8._0_8_ = &local_158;
  local_b8._8_8_ = 4;
  variables._M_len = local_b8._0_8_;
  createMacro(parser,(string *)registers,(int)local_a8,variables);
  local_1b0 = (AssemblyTemplateArgument *)local_b8;
  do {
    local_1b0 = local_1b0 + -1;
    AssemblyTemplateArgument::~AssemblyTemplateArgument(local_1b0);
  } while (local_1b0 != &local_158);
  macroText.field_2._8_4_ = 1;
  std::__cxx11::string::~string((string *)local_a8);
LAB_002133c4:
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string((string *)(subop.field_2._M_local_buf + 8));
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> generateMipsMacroAbs(Parser& parser, MipsRegisterData& registers, MipsImmediateData& immediates, int flags)
{
	const char* templateAbs = R"(
		%sraop% 	r1,%rs%,31
		xor 		%rd%,%rs%,r1
		%subop% 	%rd%,%rd%,r1
	)";

	std::string sraop, subop;

	switch (flags & MIPSM_ACCESSMASK)
	{
	case MIPSM_W:	sraop = "sra"; subop = "subu"; break;
	case MIPSM_DW:	sraop = "dsra32"; subop = "dsubu"; break;
	default: return nullptr;
	}

	std::string macroText = preprocessMacro(templateAbs,immediates);
	return createMacro(parser,macroText,flags, {
			{ "%rd%",		registers.grd.name.string() },
			{ "%rs%",		registers.grs.name.string() },
			{ "%sraop%",	sraop },
			{ "%subop%",	subop },
	});
}